

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O1

void __thiscall soul::HEARTGenerator::visit(HEARTGenerator *this,StructMemberRef *a)

{
  Variable *dest;
  pointer pcVar1;
  int iVar2;
  Expression *pEVar3;
  StructElement *source;
  undefined4 extraout_var;
  Type structType;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  Type local_40;
  
  getStructType(&local_40,this,a);
  pEVar3 = evaluateAsExpression(this,(a->object).object,&local_40);
  dest = (this->currentTargetVariable).object;
  if (dest != (Variable *)0x0) {
    pcVar1 = (a->memberName)._M_dataplus._M_p;
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,pcVar1,pcVar1 + (a->memberName)._M_string_length);
    source = PoolAllocator::
             allocate<soul::heart::StructElement,soul::CodeLocation&,soul::heart::Expression&,std::__cxx11::string>
                       (&((this->builder).super_BlockBuilder.module)->allocator->pool,
                        &(pEVar3->super_Object).location,pEVar3,&local_60);
    iVar2 = (*(dest->super_Expression).super_Object._vptr_Object[2])(dest);
    pEVar3 = BlockBuilder::createCastIfNeeded
                       ((this->builder).super_BlockBuilder.module,&source->super_Expression,
                        (Type *)CONCAT44(extraout_var,iVar2));
    BlockBuilder::addAssignment(&(this->builder).super_BlockBuilder,&dest->super_Expression,pEVar3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  RefCountedPtr<soul::Structure>::decIfNotNull(local_40.structure.object);
  return;
}

Assistant:

void visit (AST::StructMemberRef& a) override
    {
        auto structType = getStructType (a);
        auto& source = evaluateAsExpression (a.object, structType);

        if (currentTargetVariable != nullptr)
            builder.addCastOrAssignment (*currentTargetVariable, builder.createStructElement (source, a.memberName));
    }